

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O3

void __thiscall cppnet::Dispatcher::DoTask(Dispatcher *this)

{
  undefined8 uVar1;
  long lVar2;
  ulong uVar3;
  unique_lock<std::mutex> lock;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_38;
  unique_lock<std::mutex> local_20;
  
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20._M_device = &this->_task_list_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->_task_list).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->_task_list).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->_task_list).
       super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->_task_list).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_task_list).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_task_list).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  if (local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      if (*(long *)((long)&((local_38.
                             super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                           _M_manager + lVar2) == 0) {
        uVar1 = std::__throw_bad_function_call();
        std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector
                  (&local_38);
        _Unwind_Resume(uVar1);
      }
      (**(code **)((long)&(local_38.
                           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_invoker + lVar2))
                ((long)&((local_38.
                          super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                        _M_functor + lVar2);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x20;
    } while (uVar3 < (ulong)((long)local_38.
                                   super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_38.
                                   super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector(&local_38);
  return;
}

Assistant:

void Dispatcher::DoTask() {
    std::vector<Task> func_vec;
    {
        std::unique_lock<std::mutex> lock(_task_list_mutex);
        func_vec.swap(_task_list);
    }

    for (std::size_t i = 0; i < func_vec.size(); ++i) {
        func_vec[i]();
    }
}